

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O1

CharCount Js::CompoundString::BlockInfo::AlignCharCapacityForAllocation(CharCount charCapacity)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = charCapacity + (charCapacity == 0);
  uVar1 = uVar2 + 7 & 0xfffffff8;
  if (uVar2 <= uVar1) {
    return uVar1;
  }
  ::Math::DefaultOverflowPolicy();
}

Assistant:

CharCount CompoundString::BlockInfo::AlignCharCapacityForAllocation(const CharCount charCapacity)
    {
        const CharCount alignedCharCapacity =
            ::Math::AlignOverflowCheck(
                charCapacity == 0 ? static_cast<CharCount>(1) : charCapacity,
                static_cast<CharCount>(HeapConstants::ObjectGranularity / sizeof(char16)));
        Assert(alignedCharCapacity != 0);
        return alignedCharCapacity;
    }